

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsvg.c
# Opt level: O1

FT_Error ft_svg_preset_slot(FT_Module module,FT_GlyphSlot slot,FT_Bool cache)

{
  FT_Memory UNRECOVERED_JUMPTABLE;
  FT_Error FVar1;
  SVG_Renderer svg_renderer;
  
  if (*(char *)((long)&module[5].library + 1) != '\0') {
    UNRECOVERED_JUMPTABLE = module[6].memory;
    if (*(char *)&module[5].library == '\0') {
      (*(code *)module[5].memory)(module + 7);
      *(undefined1 *)&module[5].library = 1;
    }
    FVar1 = (*(code *)UNRECOVERED_JUMPTABLE)(slot,cache,module + 7);
    return FVar1;
  }
  return 0x9e;
}

Assistant:

static FT_Error
  ft_svg_preset_slot( FT_Module     module,
                      FT_GlyphSlot  slot,
                      FT_Bool       cache )
  {
    SVG_Renderer       svg_renderer = (SVG_Renderer)module;
    SVG_RendererHooks  hooks        = svg_renderer->hooks;


    if ( svg_renderer->hooks_set == FALSE )
    {
      FT_TRACE1(( "Hooks are NOT set.  Can't render OT-SVG glyphs\n" ));
      return FT_THROW( Missing_SVG_Hooks );
    }

    if ( svg_renderer->loaded == FALSE )
    {
      FT_TRACE3(( "ft_svg_preset_slot: first presetting call,"
                  " calling init hook\n" ));
      hooks.init_svg( &svg_renderer->state );

      svg_renderer->loaded = TRUE;
    }

    return hooks.preset_slot( slot, cache, &svg_renderer->state );
  }